

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O1

void __thiscall QDBusListener::loadJson(QDBusListener *this,QString *fileName)

{
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *this_00;
  const_iterator cVar1;
  int *piVar2;
  Data *this_01;
  char cVar3;
  int iVar4;
  Provider PVar5;
  Setting SVar6;
  long lVar7;
  Latin1Content LVar8;
  QTextStream *pQVar9;
  char16_t *pcVar10;
  storage_type *psVar11;
  char *pcVar12;
  bool *pbVar13;
  undefined8 *puVar14;
  QString *this_02;
  QMetaObject *metaObject;
  QMetaObject *metaObject_1;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QJsonValueConstRef QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  undefined1 auVar48 [16];
  const_iterator cVar49;
  bool success;
  QJsonDocument doc;
  QJsonParseError error;
  QDebug local_158;
  QArrayData *local_150;
  undefined8 *local_148;
  QArrayData *local_138;
  undefined8 *local_130;
  QArrayData *local_120;
  char16_t *local_118;
  qsizetype qStack_110;
  QString local_108;
  QJsonObject local_f0 [8];
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_e8;
  ulong uStack_e0;
  QJsonArray local_d8 [8];
  QJsonObject local_d0 [8];
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  QString local_a0;
  pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
  local_88;
  char *local_70;
  DBusKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_b8,fileName);
  cVar3 = QFile::exists();
  if (cVar3 == '\0') {
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
       ) goto LAB_006557ad;
    local_68.location.d.d._0_4_ = 2;
    local_68.location.d.d._4_4_ = 0;
    local_68.location.d.ptr._0_4_ = 0;
    local_68.location.d.ptr._4_4_ = 0;
    local_68.location.d.size._0_4_ = 0;
    local_68.location.d.size._4_4_ = 0;
    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
    QMessageLogger::warning();
    pcVar10 = (fileName->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
    if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
        (QTextStream)0x1) {
      QTextStream::operator<<
                ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
    }
    pcVar10 = (fileName->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
    if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
        (QTextStream)0x1) {
      QTextStream::operator<<
                ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
    }
    pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
    psVar11 = (storage_type *)0xe;
  }
  else {
    cVar3 = QFile::open(&local_b8,1);
    if (cVar3 != '\0') {
      local_c8._8_8_ = (char *)0xffffffff;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QIODevice::readAll();
      QJsonDocument::fromJson((QByteArray *)local_c8,(QJsonParseError *)&local_68);
      piVar2 = (int *)CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_)
                     ,1,0x10);
        }
      }
      if (local_c8._12_4_ == 0) {
        cVar3 = QJsonDocument::isObject();
        if (cVar3 == '\0') {
          lcQpaThemeDBus();
          if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1
              ) != 0) {
            local_68.location.d.d._0_4_ = 2;
            local_68.location.d.d._4_4_ = 0;
            local_68.location.d.ptr._0_4_ = 0;
            local_68.location.d.ptr._4_4_ = 0;
            local_68.location.d.size._0_4_ = 0;
            local_68.location.d.size._4_4_ = 0;
            local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
            QMessageLogger::warning();
            pcVar10 = (fileName->d).ptr;
            if (pcVar10 == (char16_t *)0x0) {
              pcVar10 = (char16_t *)&QString::_empty;
            }
            QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
            if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                (QTextStream)0x1) {
              QTextStream::operator<<
                        ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
            }
            pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
            QVar24.m_data = (storage_type *)0x21;
            QVar24.m_size = (qsizetype)&local_88;
            QString::fromUtf8(QVar24);
            QTextStream::operator<<(pQVar9,(QString *)&local_88);
            piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                           0x10);
              }
            }
            if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                (QTextStream)0x1) {
              QTextStream::operator<<
                        ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
            }
            QDebug::putByteArray((char *)&local_a0,0x6db713,0x14);
            if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                (QTextStream)0x1) {
              QTextStream::operator<<
                        ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
            }
            pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
            QVar25.m_data = (storage_type *)0x18;
            QVar25.m_size = (qsizetype)&local_88;
            QString::fromUtf8(QVar25);
            QTextStream::operator<<(pQVar9,(QString *)&local_88);
            piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                           0x10);
              }
            }
            if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                (QTextStream)0x1) {
              QTextStream::operator<<
                        ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
            }
            this_02 = &local_a0;
            goto LAB_00654783;
          }
        }
        else {
          QJsonDocument::object();
          QVar18.m_data = (char *)0x14;
          QVar18.m_size = (qsizetype)local_d0;
          cVar3 = QJsonObject::contains(QVar18);
          if (cVar3 == '\0') {
            lcQpaThemeDBus();
            if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                1) != 0) {
              local_68.location.d.d._0_4_ = 2;
              local_68.location.d.d._4_4_ = 0;
              local_68.location.d.ptr._0_4_ = 0;
              local_68.location.d.ptr._4_4_ = 0;
              local_68.location.d.size._0_4_ = 0;
              local_68.location.d.size._4_4_ = 0;
              local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
              QMessageLogger::warning();
              pcVar10 = (fileName->d).ptr;
              if (pcVar10 == (char16_t *)0x0) {
                pcVar10 = (char16_t *)&QString::_empty;
              }
              QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
              if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                  (QTextStream)0x1) {
                QTextStream::operator<<
                          ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
              }
              pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
              QVar26.m_data = (storage_type *)0x22;
              QVar26.m_size = (qsizetype)&local_88;
              QString::fromUtf8(QVar26);
              QTextStream::operator<<(pQVar9,(QString *)&local_88);
              piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2
                             ,0x10);
                }
              }
              if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                  (QTextStream)0x1) {
                QTextStream::operator<<
                          ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
              }
              pcVar12 = "Q_L1.qpa.DBusSignals";
              LVar8 = 0x14;
LAB_0065498c:
              QDebug::putByteArray((char *)&local_a0,(ulong)pcVar12,LVar8);
              if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                  (QTextStream)0x1) {
                QTextStream::operator<<
                          ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
              }
              pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
              QVar28.m_data = (storage_type *)0x18;
              QVar28.m_size = (qsizetype)&local_88;
              QString::fromUtf8(QVar28);
              QTextStream::operator<<(pQVar9,(QString *)&local_88);
              piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2
                             ,0x10);
                }
              }
              if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                  (QTextStream)0x1) {
                QTextStream::operator<<
                          ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
              }
              QDebug::~QDebug((QDebug *)&local_a0);
            }
          }
          else {
            QVar19.m_data = (char *)local_d0;
            QVar19.m_size = (qsizetype)&local_88;
            QJsonObject::value(QVar19);
            QVar20.m_data = (char *)&local_88;
            QVar20.m_size = (qsizetype)&local_68;
            QJsonValue::operator[](QVar20);
            iVar4 = QJsonValue::type();
            QJsonValue::~QJsonValue((QJsonValue *)&local_68);
            QJsonValue::~QJsonValue((QJsonValue *)&local_88);
            if (iVar4 == 4) {
              QVar21.m_data = (char *)local_d0;
              QVar21.m_size = (qsizetype)&local_88;
              QJsonObject::value(QVar21);
              QVar22.m_data = (char *)&local_88;
              QVar22.m_size = (qsizetype)&local_68;
              QJsonValue::operator[](QVar22);
              QJsonValue::toArray();
              QJsonValue::~QJsonValue((QJsonValue *)&local_68);
              QJsonValue::~QJsonValue((QJsonValue *)&local_88);
              lVar7 = QJsonArray::size();
              if (lVar7 < 1) {
                lcQpaThemeDBus();
                if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                           _M_i & 1) != 0) {
                  loadJson((QDBusListener *)fileName);
                }
              }
              else {
                uStack_e0 = 0;
                local_e8.a = local_d8;
                lVar7 = QJsonArray::size();
                if ((local_e8.a != local_d8) || (1 < (lVar7 * 2 ^ uStack_e0))) {
                  this_00 = &this->m_signalMap;
                  do {
                    QVar29._8_8_ = uStack_e0;
                    QVar29.field_0.a = local_e8.a;
                    iVar4 = QJsonValueConstRef::concreteType(QVar29);
                    if (iVar4 != 5) {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        loadJson((QDBusListener *)fileName);
                      }
                      goto LAB_00655786;
                    }
                    QJsonValueConstRef::toObject();
                    QVar30.m_data = (char *)0xc;
                    QVar30.m_size = (qsizetype)local_f0;
                    cVar3 = QJsonObject::contains(QVar30);
                    if (cVar3 == '\0') {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        loadJson((QDBusListener *)fileName);
                      }
LAB_00655779:
                      QJsonObject::~QJsonObject(local_f0);
                      goto LAB_00655786;
                    }
                    QVar31.m_data = (char *)0x7;
                    QVar31.m_size = (qsizetype)local_f0;
                    cVar3 = QJsonObject::contains(QVar31);
                    if (cVar3 == '\0') {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        loadJson((QDBusListener *)fileName);
                      }
                      goto LAB_00655779;
                    }
                    QVar32.m_data = (char *)0x8;
                    QVar32.m_size = (qsizetype)local_f0;
                    cVar3 = QJsonObject::contains(QVar32);
                    if (cVar3 == '\0') {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        loadJson((QDBusListener *)fileName);
                      }
                      goto LAB_00655779;
                    }
                    QVar33.m_data = (char *)0x7;
                    QVar33.m_size = (qsizetype)local_f0;
                    cVar3 = QJsonObject::contains(QVar33);
                    if (cVar3 == '\0') {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        loadJson((QDBusListener *)fileName);
                      }
                      goto LAB_00655779;
                    }
                    QVar34.m_data = (char *)local_f0;
                    QVar34.m_size = (qsizetype)&local_68;
                    QJsonObject::value(QVar34);
                    QJsonValue::toString();
                    QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                    QVar35.m_data = (char *)local_f0;
                    QVar35.m_size = (qsizetype)&local_68;
                    QJsonObject::value(QVar35);
                    QJsonValue::toString();
                    QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                    QVar36.m_data = (char *)local_f0;
                    QVar36.m_size = (qsizetype)&local_68;
                    QJsonObject::value(QVar36);
                    QJsonValue::toString();
                    QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                    QVar37.m_data = (char *)local_f0;
                    QVar37.m_size = (qsizetype)&local_68;
                    QJsonObject::value(QVar37);
                    QJsonValue::toString();
                    QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                    local_158.stream._0_1_ = -0x56;
                    QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
                    auVar48 = QMetaObject::enumerator(0x7e21e8);
                    local_88.first.c._0_4_ = auVar48._0_4_;
                    local_88.first.c._4_4_ = auVar48._4_4_;
                    local_88.first.i._0_4_ = auVar48._8_4_;
                    local_88.first.i._4_4_ = auVar48._12_4_;
                    QString::toLatin1_helper(&local_68.location);
                    pbVar13 = (bool *)CONCAT44(local_68.location.d.ptr._4_4_,
                                               local_68.location.d.ptr._0_4_);
                    if (pbVar13 == (bool *)0x0) {
                      pbVar13 = (bool *)&QByteArray::_empty;
                    }
                    PVar5 = QMetaEnum::keyToValue((char *)&local_88,pbVar13);
                    piVar2 = (int *)CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_
                                            );
                    if (piVar2 != (int *)0x0) {
                      LOCK();
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        QArrayData::deallocate
                                  ((QArrayData *)
                                   CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_)
                                   ,1,0x10);
                      }
                    }
                    cVar3 = (char)local_158.stream;
                    if ((char)local_158.stream == '\0') {
                      lcQpaThemeDBus();
                      PVar5 = 0xaaaaaaaa;
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        local_68.location.d.d._0_4_ = 2;
                        local_68.location.d.d._4_4_ = 0;
                        local_68.location.d.ptr._0_4_ = 0;
                        local_68.location.d.ptr._4_4_ = 0;
                        local_68.location.d.size._0_4_ = 0;
                        local_68.location.d.size._4_4_ = 0;
                        local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                        QMessageLogger::warning();
                        pcVar10 = (fileName->d).ptr;
                        if (pcVar10 == (char16_t *)0x0) {
                          pcVar10 = (char16_t *)&QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar38.m_data = (storage_type *)0x1a;
                        QVar38.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar38);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        puVar14 = local_130;
                        if (local_130 == (undefined8 *)0x0) {
                          puVar14 = &QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_a0,(ulong)puVar14);
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar39.m_data = (storage_type *)0x3;
                        QVar39.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar39);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar40.m_data = (storage_type *)0x8;
                        QVar40.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar40);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar41.m_data = (storage_type *)0x18;
                        QVar41.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar41);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        PVar5 = 0xaaaaaaaa;
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        QDebug::~QDebug((QDebug *)&local_a0);
                      }
                    }
                    if (cVar3 == '\0') {
LAB_00655670:
                      if (local_150 != (QArrayData *)0x0) {
                        LOCK();
                        (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_150,2,0x10);
                        }
                      }
                      if (local_138 != (QArrayData *)0x0) {
                        LOCK();
                        (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_138,2,0x10);
                        }
                      }
                      if (local_120 != (QArrayData *)0x0) {
                        LOCK();
                        (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_120,2,0x10);
                        }
                      }
                      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_108.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_108.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      goto LAB_00655779;
                    }
                    local_158.stream._0_1_ = -0x56;
                    QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
                    auVar48 = QMetaObject::enumerator(0x7e21e8);
                    local_88.first.c._0_4_ = auVar48._0_4_;
                    local_88.first.c._4_4_ = auVar48._4_4_;
                    local_88.first.i._0_4_ = auVar48._8_4_;
                    local_88.first.i._4_4_ = auVar48._12_4_;
                    QString::toLatin1_helper(&local_68.location);
                    pbVar13 = (bool *)CONCAT44(local_68.location.d.ptr._4_4_,
                                               local_68.location.d.ptr._0_4_);
                    if (pbVar13 == (bool *)0x0) {
                      pbVar13 = (bool *)&QByteArray::_empty;
                    }
                    SVar6 = QMetaEnum::keyToValue((char *)&local_88,pbVar13);
                    piVar2 = (int *)CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_
                                            );
                    if (piVar2 != (int *)0x0) {
                      LOCK();
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        QArrayData::deallocate
                                  ((QArrayData *)
                                   CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_)
                                   ,1,0x10);
                      }
                    }
                    cVar3 = (char)local_158.stream;
                    if ((char)local_158.stream == '\0') {
                      lcQpaThemeDBus();
                      SVar6 = 0xaaaaaaaa;
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        local_68.location.d.d._0_4_ = 2;
                        local_68.location.d.d._4_4_ = 0;
                        local_68.location.d.ptr._0_4_ = 0;
                        local_68.location.d.ptr._4_4_ = 0;
                        local_68.location.d.size._0_4_ = 0;
                        local_68.location.d.size._4_4_ = 0;
                        local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                        QMessageLogger::warning();
                        pcVar10 = (fileName->d).ptr;
                        if (pcVar10 == (char16_t *)0x0) {
                          pcVar10 = (char16_t *)&QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar42.m_data = (storage_type *)0x1a;
                        QVar42.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar42);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        puVar14 = local_148;
                        if (local_148 == (undefined8 *)0x0) {
                          puVar14 = &QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_a0,(ulong)puVar14);
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar43.m_data = (storage_type *)0x3;
                        QVar43.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar43);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar44.m_data = (storage_type *)0x7;
                        QVar44.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar44);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        QVar45.m_data = (storage_type *)0x18;
                        QVar45.m_size = (qsizetype)&local_88;
                        QString::fromUtf8(QVar45);
                        QTextStream::operator<<(pQVar9,(QString *)&local_88);
                        piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                                       0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
                        }
                        QDebug::~QDebug((QDebug *)&local_a0);
                      }
                    }
                    if (cVar3 == '\0') goto LAB_00655670;
                    local_68.location.d.d._0_4_ = SUB84(local_108.d.d,0);
                    local_68.location.d.d._4_4_ = (undefined4)((ulong)local_108.d.d >> 0x20);
                    local_68.location.d.ptr._0_4_ = SUB84(local_108.d.ptr,0);
                    local_68.location.d.ptr._4_4_ = (undefined4)((ulong)local_108.d.ptr >> 0x20);
                    local_68.location.d.size._0_4_ = (undefined4)local_108.d.size;
                    local_68.location.d.size._4_4_ = (undefined4)((ulong)local_108.d.size >> 0x20);
                    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_108.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    local_68.key.d.d = (Data *)local_120;
                    local_68.key.d.ptr = local_118;
                    local_68.key.d.size = qStack_110;
                    if (local_120 != (QArrayData *)0x0) {
                      LOCK();
                      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    cVar49 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                             ::find(this_00,&local_68);
                    cVar1.i = (this->m_signalMap).c.keys.d.size;
                    cVar1.c = &this_00->c;
                    if (cVar49 == cVar1) {
                      local_a0.d.d._0_4_ = PVar5;
                      local_a0.d.d._4_4_ = SVar6;
                      QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                      ::try_emplace<QDBusListener::ChangeSignal>
                                (&local_88,this_00,&local_68,(ChangeSignal *)&local_a0);
                    }
                    else {
                      lcQpaThemeDBus();
                      if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                                 _M_base._M_i & 1) != 0) {
                        local_88.first.c._0_4_ = 2;
                        local_88.first.c._4_4_ = 0;
                        local_88.first.i._0_4_ = 0;
                        local_88.first.i._4_4_ = 0;
                        local_88.second = false;
                        local_88._17_3_ = 0;
                        local_88._20_4_ = 0;
                        local_70 = lcQpaThemeDBus::category.name;
                        QMessageLogger::warning();
                        pcVar10 = (fileName->d).ptr;
                        if (pcVar10 == (char16_t *)0x0) {
                          pcVar10 = (char16_t *)&QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_158,(ulong)pcVar10);
                        if (((QTextStream *)CONCAT71(local_158.stream._1_7_,(char)local_158.stream))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT71(local_158.stream._1_7_,(char)local_158.stream),' ');
                        }
                        pQVar9 = (QTextStream *)
                                 CONCAT71(local_158.stream._1_7_,(char)local_158.stream);
                        QVar46.m_data = (storage_type *)0xd;
                        QVar46.m_size = (qsizetype)&local_a0;
                        QString::fromUtf8(QVar46);
                        QTextStream::operator<<(pQVar9,&local_a0);
                        piVar2 = (int *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),2,0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT71(local_158.stream._1_7_,(char)local_158.stream))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT71(local_158.stream._1_7_,(char)local_158.stream),' ');
                        }
                        pcVar10 = local_108.d.ptr;
                        if (local_108.d.ptr == (char16_t *)0x0) {
                          pcVar10 = (char16_t *)&QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_158,(ulong)pcVar10);
                        if (((QTextStream *)CONCAT71(local_158.stream._1_7_,(char)local_158.stream))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT71(local_158.stream._1_7_,(char)local_158.stream),' ');
                        }
                        pcVar10 = local_118;
                        if (local_118 == (char16_t *)0x0) {
                          pcVar10 = (char16_t *)&QString::_empty;
                        }
                        QDebug::putString((QChar *)&local_158,(ulong)pcVar10);
                        if (((QTextStream *)CONCAT71(local_158.stream._1_7_,(char)local_158.stream))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT71(local_158.stream._1_7_,(char)local_158.stream),' ');
                        }
                        pQVar9 = (QTextStream *)
                                 CONCAT71(local_158.stream._1_7_,(char)local_158.stream);
                        QVar47.m_data = (storage_type *)0x18;
                        QVar47.m_size = (qsizetype)&local_a0;
                        QString::fromUtf8(QVar47);
                        QTextStream::operator<<(pQVar9,&local_a0);
                        piVar2 = (int *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            QArrayData::deallocate
                                      ((QArrayData *)
                                       CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),2,0x10);
                          }
                        }
                        if (((QTextStream *)CONCAT71(local_158.stream._1_7_,(char)local_158.stream))
                            [0x30] == (QTextStream)0x1) {
                          QTextStream::operator<<
                                    ((QTextStream *)
                                     CONCAT71(local_158.stream._1_7_,(char)local_158.stream),' ');
                        }
                        QDebug::~QDebug(&local_158);
                      }
                    }
                    if (&(local_68.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_68.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_68.key.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_68.key.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_68.key.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    piVar2 = (int *)CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_
                                            );
                    if (piVar2 != (int *)0x0) {
                      LOCK();
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        QArrayData::deallocate
                                  ((QArrayData *)
                                   CONCAT44(local_68.location.d.d._4_4_,local_68.location.d.d._0_4_)
                                   ,2,0x10);
                      }
                    }
                    if (local_150 != (QArrayData *)0x0) {
                      LOCK();
                      (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_150,2,0x10);
                      }
                    }
                    if (local_138 != (QArrayData *)0x0) {
                      LOCK();
                      (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_138,2,0x10);
                      }
                    }
                    if (local_120 != (QArrayData *)0x0) {
                      LOCK();
                      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_120,2,0x10);
                      }
                    }
                    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_108.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QJsonObject::~QJsonObject(local_f0);
                    if (cVar49 != cVar1) goto LAB_00655786;
                    uStack_e0 = uStack_e0 + 2;
                    lVar7 = QJsonArray::size();
                  } while ((local_e8.a != local_d8) || (1 < (lVar7 * 2 ^ uStack_e0)));
                }
                lVar7 = (this->m_signalMap).c.keys.d.size;
                lcQpaThemeDBus();
                if (lVar7 == 0) {
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    loadJson((QDBusListener *)fileName);
                  }
                }
                else if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledInfo._q_value._M_base.
                                _M_i & 1) != 0) {
                  local_68.location.d.d._0_4_ = 2;
                  local_68.location.d.d._4_4_ = 0;
                  local_68.location.d.ptr._0_4_ = 0;
                  local_68.location.d.ptr._4_4_ = 0;
                  local_68.location.d.size._0_4_ = 0;
                  local_68.location.d.size._4_4_ = 0;
                  local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                  QMessageLogger::info();
                  pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                  QVar23.m_data = (storage_type *)0x15;
                  QVar23.m_size = (qsizetype)&local_88;
                  QString::fromUtf8(QVar23);
                  QTextStream::operator<<(pQVar9,(QString *)&local_88);
                  piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)
                                 CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,0x10);
                    }
                  }
                  if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                      (QTextStream)0x1) {
                    QTextStream::operator<<
                              ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),
                               ' ');
                  }
                  pcVar10 = (fileName->d).ptr;
                  if (pcVar10 == (char16_t *)0x0) {
                    pcVar10 = (char16_t *)&QString::_empty;
                  }
                  QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
                  if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                      (QTextStream)0x1) {
                    QTextStream::operator<<
                              ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),
                               ' ');
                  }
                  QDebug::~QDebug((QDebug *)&local_a0);
                }
              }
LAB_00655786:
              QJsonArray::~QJsonArray(local_d8);
            }
            else {
              lcQpaThemeDBus();
              if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                  & 1) != 0) {
                local_68.location.d.d._0_4_ = 2;
                local_68.location.d.d._4_4_ = 0;
                local_68.location.d.ptr._0_4_ = 0;
                local_68.location.d.ptr._4_4_ = 0;
                local_68.location.d.size._0_4_ = 0;
                local_68.location.d.size._4_4_ = 0;
                local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                QMessageLogger::warning();
                pcVar10 = (fileName->d).ptr;
                if (pcVar10 == (char16_t *)0x0) {
                  pcVar10 = (char16_t *)&QString::_empty;
                }
                QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
                if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                    (QTextStream)0x1) {
                  QTextStream::operator<<
                            ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ')
                  ;
                }
                pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
                QVar27.m_data = (storage_type *)0x1b;
                QVar27.m_size = (qsizetype)&local_88;
                QString::fromUtf8(QVar27);
                QTextStream::operator<<(pQVar9,(QString *)&local_88);
                piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_)
                               ,2,0x10);
                  }
                }
                if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
                    (QTextStream)0x1) {
                  QTextStream::operator<<
                            ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ')
                  ;
                }
                pcVar12 = "DbusSignals";
                LVar8 = 0xb;
                goto LAB_0065498c;
              }
            }
          }
          QJsonObject::~QJsonObject(local_d0);
        }
      }
      else {
        lcQpaThemeDBus();
        if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_68.location.d.d._0_4_ = 2;
          local_68.location.d.d._4_4_ = 0;
          local_68.location.d.ptr._0_4_ = 0;
          local_68.location.d.ptr._4_4_ = 0;
          local_68.location.d.size._0_4_ = 0;
          local_68.location.d.size._4_4_ = 0;
          local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
          QMessageLogger::warning();
          pcVar10 = (fileName->d).ptr;
          if (pcVar10 == (char16_t *)0x0) {
            pcVar10 = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_108,(ulong)pcVar10);
          if (*(char *)&local_108.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                        _M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_108.d.d,' ');
          }
          QJsonParseError::errorString();
          if (local_a0.d.ptr == (char16_t *)0x0) {
            local_a0.d.ptr = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_108,(ulong)local_a0.d.ptr);
          if (*(char *)&local_108.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                        _M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_108.d.d,' ');
          }
          this_01 = local_108.d.d;
          QVar15.m_data = (storage_type *)0x18;
          QVar15.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)this_01,(QString *)&local_88);
          piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,
                         0x10);
            }
          }
          if (*(char *)&local_108.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>.
                        _M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_108.d.d,' ');
          }
          piVar2 = (int *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),2,0x10);
            }
          }
          this_02 = &local_108;
LAB_00654783:
          QDebug::~QDebug((QDebug *)this_02);
        }
      }
      QJsonDocument::~QJsonDocument((QJsonDocument *)local_c8);
      goto LAB_006557ad;
    }
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
       ) goto LAB_006557ad;
    local_68.location.d.d._0_4_ = 2;
    local_68.location.d.d._4_4_ = 0;
    local_68.location.d.ptr._0_4_ = 0;
    local_68.location.d.ptr._4_4_ = 0;
    local_68.location.d.size._0_4_ = 0;
    local_68.location.d.size._4_4_ = 0;
    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
    QMessageLogger::warning();
    pcVar10 = (fileName->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_a0,(ulong)pcVar10);
    if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] ==
        (QTextStream)0x1) {
      QTextStream::operator<<
                ((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
    }
    pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
    psVar11 = (storage_type *)0x20;
  }
  QVar16.m_data = psVar11;
  QVar16.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar16);
  QTextStream::operator<<(pQVar9,(QString *)&local_88);
  piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,0x10);
    }
  }
  if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] == (QTextStream)0x1
     ) {
    QTextStream::operator<<((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
  }
  pQVar9 = (QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d);
  QVar17.m_data = (storage_type *)0x18;
  QVar17.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar17);
  QTextStream::operator<<(pQVar9,(QString *)&local_88);
  piVar2 = (int *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_88.first.c._4_4_,local_88.first.c._0_4_),2,0x10);
    }
  }
  if (((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d))[0x30] == (QTextStream)0x1
     ) {
    QTextStream::operator<<((QTextStream *)CONCAT44(local_a0.d.d._4_4_,(Provider)local_a0.d.d),' ');
  }
  QDebug::~QDebug((QDebug *)&local_a0);
LAB_006557ad:
  QFile::~QFile((QFile *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusListener::loadJson(const QString &fileName)
{
    Q_ASSERT(!fileName.isEmpty());
#define CHECK(cond, warning)\
    if (!cond) {\
        qCWarning(lcQpaThemeDBus) << fileName << warning << "Falling back to default.";\
        return;\
    }

#define PARSE(var, enumeration, string)\
    enumeration var;\
    {\
        bool success;\
        const int val = QMetaEnum::fromType<enumeration>().keyToValue(string.toLatin1(), &success);\
        CHECK(success, "Parse Error: Invalid value" << string << "for" << #var);\
        var = static_cast<enumeration>(val);\
    }

    QFile file(fileName);
    CHECK(file.exists(), fileName << "doesn't exist.");
    CHECK(file.open(QIODevice::ReadOnly), "could not be opened for reading.");

    QJsonParseError error;
    QJsonDocument doc = QJsonDocument::fromJson(file.readAll(), &error);
    CHECK((error.error == QJsonParseError::NoError), error.errorString());
    CHECK(doc.isObject(), "Parse Error: Expected root object" << JsonKeys::root());

    const QJsonObject &root = doc.object();
    CHECK(root.contains(JsonKeys::root()), "Parse Error: Expectned root object" << JsonKeys::root());
    CHECK(root[JsonKeys::root()][JsonKeys::dbusSignals()].isArray(), "Parse Error: Expected array" << JsonKeys::dbusSignals());

    const QJsonArray &sigs = root[JsonKeys::root()][JsonKeys::dbusSignals()].toArray();
    CHECK((sigs.count() > 0), "Parse Error: Found empty array" << JsonKeys::dbusSignals());

    for (auto sig = sigs.constBegin(); sig != sigs.constEnd(); ++sig) {
        CHECK(sig->isObject(), "Parse Error: Expected object array" << JsonKeys::dbusSignals());
        const QJsonObject &obj = sig->toObject();
        CHECK(obj.contains(JsonKeys::dbusLocation()), "Parse Error: Expected key" << JsonKeys::dbusLocation());
        CHECK(obj.contains(JsonKeys::dbusKey()), "Parse Error: Expected key" << JsonKeys::dbusKey());
        CHECK(obj.contains(JsonKeys::provider()), "Parse Error: Expected key" << JsonKeys::provider());
        CHECK(obj.contains(JsonKeys::setting()), "Parse Error: Expected key" << JsonKeys::setting());
        const QString &location = obj[JsonKeys::dbusLocation()].toString();
        const QString &key = obj[JsonKeys::dbusKey()].toString();
        const QString &providerString = obj[JsonKeys::provider()].toString();
        const QString &settingString = obj[JsonKeys::setting()].toString();
        PARSE(provider, Provider, providerString);
        PARSE(setting, Setting, settingString);
        const DBusKey dkey(location, key);
        CHECK (!m_signalMap.contains(dkey), "Duplicate key" << location << key);
        m_signalMap.insert(dkey, ChangeSignal(provider, setting));
    }
#undef PARSE
#undef CHECK

    if (m_signalMap.count() > 0)
        qCInfo(lcQpaThemeDBus) << "Successfully imported" << fileName;
    else
        qCWarning(lcQpaThemeDBus) << "No data imported from" << fileName << "falling back to default.";

#ifdef QT_DEBUG
    const int count = m_signalMap.count();
    if (count == 0)
        return;

    qCDebug(lcQpaThemeDBus) << "Listening to" << count << "signals:";
    for (auto it = m_signalMap.constBegin(); it != m_signalMap.constEnd(); ++it) {
        qDebug() << it.key().key << it.key().location << "mapped to"
                 << it.value().provider << it.value().setting;
    }

#endif
}